

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O1

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::LeaveEvent,QWindow*>(QWindow *args)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined1 uVar4;
  long in_FS_OFFSET;
  LeaveEvent event;
  WindowSystemEvent local_48;
  int *piStack_30;
  QWindow *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::LeaveEvent,QWindow*>(args);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
    goto LAB_00330b8c;
  }
  local_48._20_4_ = 0xaaaaaaaa;
  piStack_30 = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = (QWindow *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.type = Leave;
  local_48.flags = 0;
  local_48.eventAccepted = true;
  local_48._17_3_ = 0xaaaaaa;
  local_48._vptr_WindowSystemEvent = (_func_int **)&PTR__LeaveEvent_007e9df8;
  if (args == (QWindow *)0x0) {
    piStack_30 = (int *)0x0;
  }
  else {
    piStack_30 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&args->super_QObject);
  }
  local_28 = args;
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent(&local_48);
LAB_00330b4c:
    uVar4 = local_48.eventAccepted;
  }
  else {
    iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,&local_48);
    if ((char)iVar3 != '\0') goto LAB_00330b4c;
    uVar4 = 0;
  }
  local_48._vptr_WindowSystemEvent = (_func_int **)&PTR__LeaveEvent_007e9df8;
  if (piStack_30 != (int *)0x0) {
    LOCK();
    *piStack_30 = *piStack_30 + -1;
    UNLOCK();
    if ((*piStack_30 == 0) && (piStack_30 != (int *)0x0)) {
      operator_delete(piStack_30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (bool)uVar4;
  }
LAB_00330b8c:
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}